

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

double cs_time(void)

{
  int iVar1;
  double dVar2;
  timeval tv;
  timeval local_10;
  
  iVar1 = gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  dVar2 = 0.0;
  if (iVar1 == 0) {
    dVar2 = (double)local_10.tv_usec / 1000000.0 + (double)local_10.tv_sec;
  }
  return dVar2;
}

Assistant:

double cs_time() {
    double now;
#ifndef _WIN32
    struct timeval tv;
    if (gettimeofday(&tv, NULL /* tz */) != 0) return 0;
    now = (double) tv.tv_sec + (((double) tv.tv_usec) / 1000000.0);
#else
    now = GetTickCount() / 1000.0;
#endif
    return now;
}